

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleComboBox::child(QAccessibleComboBox *this,int index)

{
  bool bVar1;
  QComboBox *this_00;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  
  this_00 = comboBox(this);
  if (this_00 == (QComboBox *)0x0) {
    return (QAccessibleInterface *)0x0;
  }
  if (index == 1) {
    bVar1 = QComboBox::isEditable(this_00);
    if (!bVar1) {
      return (QAccessibleInterface *)0x0;
    }
    pQVar2 = (QObject *)QComboBox::lineEdit(this_00);
  }
  else {
    if (index != 0) {
      return (QAccessibleInterface *)0x0;
    }
    pQVar2 = (QObject *)QComboBox::view(this_00);
  }
  pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
  return pQVar3;
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::child(int index) const
{
    if (QComboBox *cBox = comboBox()) {
        if (index == 0) {
            QAbstractItemView *view = cBox->view();
            //QWidget *parent = view ? view->parentWidget() : 0;
            return QAccessible::queryAccessibleInterface(view);
        } else if (index == 1 && cBox->isEditable()) {
            return QAccessible::queryAccessibleInterface(cBox->lineEdit());
        }
    }
    return nullptr;
}